

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_pack_s32_u16(c_v64 a,c_v64 b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar2 = a.s32[1];
  if ((int)a.s32[1] < 1) {
    uVar2 = 0;
  }
  uVar3 = (ulong)uVar2;
  if (0xfffe < (int)uVar2) {
    uVar3 = 0xffff;
  }
  uVar2 = 0;
  if (0 < (int)a.s32[0]) {
    uVar2 = a.s32[0];
  }
  if (0xfffe < (int)uVar2) {
    uVar2 = 0xffff;
  }
  uVar1 = b.s32[1];
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  if (0xfffe < (int)uVar1) {
    uVar1 = 0xffff;
  }
  uVar4 = 0;
  if (0 < (int)b.s32[0]) {
    uVar4 = b.s32[0];
  }
  if (0xfffe < (int)uVar4) {
    uVar4 = 0xffff;
  }
  return (c_v64)((ulong)uVar2 << 0x20 | uVar3 << 0x30 | (ulong)(uVar1 << 0x10) | (ulong)uVar4);
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s32_u16(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.u16[3] = SIMD_CLAMP(a.s32[1], 0, 65535);
  t.u16[2] = SIMD_CLAMP(a.s32[0], 0, 65535);
  t.u16[1] = SIMD_CLAMP(b.s32[1], 0, 65535);
  t.u16[0] = SIMD_CLAMP(b.s32[0], 0, 65535);
  return t;
}